

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_store_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  MemoryAccess access;
  uint8_t *puVar1;
  Family family;
  uint8_t *puVar2;
  undefined1 local_88 [16];
  _Manager_type local_78;
  _Elt_pointer pfStack_70;
  
  family = opcode.family;
  access = get_memory_access(family);
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps((Pipeline *)local_88,this,opcode.address_mode,access);
  Pipeline::append(__return_storage_ptr__,(Pipeline *)local_88);
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque((deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            *)(local_88 + 8));
  if (family == STY) {
    puVar2 = &this->registers_->y;
  }
  else if (family == STA) {
    puVar2 = &this->registers_->a;
  }
  else {
    if (family == SAX) {
      puVar2 = &this->registers_->a;
      puVar1 = &this->registers_->x;
      goto LAB_001ad3dc;
    }
    if (family == STX) {
      puVar2 = &this->registers_->x;
    }
    else {
      puVar2 = (uint8_t *)0x0;
    }
  }
  puVar1 = (uint8_t *)0x0;
LAB_001ad3dc:
  local_78 = (_Manager_type)0x0;
  pfStack_70 = (_Elt_pointer)0x0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = (_Map_pointer)0x0;
  local_88._0_8_ = operator_new(0x18);
  *(Mos6502 **)local_88._0_8_ = this;
  *(uint8_t **)(local_88._0_8_ + 8) = puVar2;
  *(uint8_t **)(local_88._0_8_ + 0x10) = puVar1;
  pfStack_70 = (_Elt_pointer)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:843:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:843:17)>
             ::_M_manager;
  Pipeline::push(__return_storage_ptr__,(StepT *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_store_instruction(Opcode opcode) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    uint8_t *reg{};
    uint8_t *reg2{};
    if (opcode.family == Family::STX) {
        reg = &registers_->x;
    } else if (opcode.family == Family::STY) {
        reg = &registers_->y;
    } else if (opcode.family == Family::STA) {
        reg = &registers_->a;
    } else if (opcode.family == Family::SAX) {
        reg = &registers_->a;
        reg2 = &registers_->x;
    }
    result.push([this, reg, reg2] {
        const uint8_t value = reg2 == nullptr ? *reg : *reg & *reg2;
        mmu_->write_byte(effective_address_, value);
    });

    return result;
}